

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O0

bool __thiscall Assimp::ASE::Parser::ParseString(Parser *this,string *out,char *szName)

{
  char *pcVar1;
  bool bVar2;
  ulong uVar3;
  allocator local_451;
  string local_450 [32];
  char *local_430;
  char *sz;
  char szBuffer [1024];
  char *szName_local;
  string *out_local;
  Parser *this_local;
  
  szBuffer._1016_8_ = szName;
  bVar2 = SkipSpaces<char>(&this->filePtr);
  if (bVar2) {
    if (*this->filePtr == '\"') {
      this->filePtr = this->filePtr + 1;
      for (local_430 = this->filePtr; *local_430 != '\"'; local_430 = local_430 + 1) {
        if (*local_430 == '\0') {
          snprintf((char *)&sz,0x400,
                   "Unable to parse %s block: Strings are expected to be enclosed in double quotation marks but EOF was reached before a closing quotation mark was encountered"
                   ,szBuffer._1016_8_);
          LogWarning(this,(char *)&sz);
          return false;
        }
      }
      pcVar1 = this->filePtr;
      uVar3 = (long)local_430 - (long)pcVar1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_450,pcVar1,uVar3,&local_451);
      std::__cxx11::string::operator=((string *)out,local_450);
      std::__cxx11::string::~string(local_450);
      std::allocator<char>::~allocator((allocator<char> *)&local_451);
      this->filePtr = local_430 + 1;
      this_local._7_1_ = true;
    }
    else {
      snprintf((char *)&sz,0x400,
               "Unable to parse %s block: Strings are expected to be enclosed in double quotation marks"
               ,szBuffer._1016_8_);
      LogWarning(this,(char *)&sz);
      this_local._7_1_ = false;
    }
  }
  else {
    snprintf((char *)&sz,0x400,"Unable to parse %s block: Unexpected EOL",szBuffer._1016_8_);
    LogWarning(this,(char *)&sz);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::ParseString(std::string& out,const char* szName)
{
    char szBuffer[1024];
    if (!SkipSpaces(&filePtr))
    {

        ai_snprintf(szBuffer, 1024, "Unable to parse %s block: Unexpected EOL",szName);
        LogWarning(szBuffer);
        return false;
    }
    // there must be '"'
    if ('\"' != *filePtr)
    {

        ai_snprintf(szBuffer, 1024, "Unable to parse %s block: Strings are expected "
            "to be enclosed in double quotation marks",szName);
        LogWarning(szBuffer);
        return false;
    }
    ++filePtr;
    const char* sz = filePtr;
    while (true)
    {
        if ('\"' == *sz)break;
        else if ('\0' == *sz)
        {
            ai_snprintf(szBuffer, 1024, "Unable to parse %s block: Strings are expected to "
                "be enclosed in double quotation marks but EOF was reached before "
                "a closing quotation mark was encountered",szName);
            LogWarning(szBuffer);
            return false;
        }
        sz++;
    }
    out = std::string(filePtr,(uintptr_t)sz-(uintptr_t)filePtr);
    filePtr = sz+1;
    return true;
}